

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VCFrontEnd.cpp
# Opt level: O2

string * VCFrontEnd::genOutputFileName(string *__return_storage_ptr__,string *in_file,Options *opts)

{
  long lVar1;
  ostream *poVar2;
  char *pcVar3;
  char *pcVar4;
  string out_folder;
  string name;
  string folder;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  stringstream ss;
  ostream local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  lVar1 = std::__cxx11::string::rfind((char)in_file,0x2f);
  std::__cxx11::string::string((string *)&folder,".",(allocator *)&name);
  std::__cxx11::string::string((string *)&name,(string *)in_file);
  if (lVar1 != -1) {
    std::__cxx11::string::substr((ulong)&out_folder,(ulong)in_file);
    std::__cxx11::string::operator=((string *)&folder,(string *)&out_folder);
    std::__cxx11::string::~string((string *)&out_folder);
    std::__cxx11::string::substr((ulong)&out_folder,(ulong)in_file);
    std::__cxx11::string::operator=((string *)&name,(string *)&out_folder);
    std::__cxx11::string::~string((string *)&out_folder);
  }
  std::__cxx11::string::rfind((char)&name,0x2e);
  std::__cxx11::string::substr((ulong)&out_folder,(ulong)&name);
  std::__cxx11::string::operator=((string *)&name,(string *)&out_folder);
  std::__cxx11::string::~string((string *)&out_folder);
  std::operator+(&out_folder,&folder,"/outputs");
  std::operator+(&local_1d0,"mkdir -p ",&out_folder);
  system(local_1d0._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_1d0);
  poVar2 = std::operator<<(local_1a0,(string *)&out_folder);
  poVar2 = std::operator<<(poVar2,"/");
  std::operator<<(poVar2,(string *)&name);
  pcVar3 = "_uni";
  if ((opts->adaptive & 1U) != 0) {
    pcVar3 = "_adp";
  }
  pcVar4 = "_ais";
  if (opts->anisotropic == false) {
    pcVar4 = pcVar3;
  }
  std::operator<<(local_1a0,pcVar4);
  if (opts->quadMetric == true) {
    std::operator<<(local_1a0,"_q");
  }
  if (opts->validation == true) {
    std::operator<<(local_1a0,"_v");
  }
  if (opts->ringLevel != 2) {
    poVar2 = std::operator<<(local_1a0,"_r");
    std::ostream::operator<<(poVar2,opts->ringLevel);
  }
  poVar2 = std::operator<<(local_1a0,"_");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,".obj");
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::~string((string *)&out_folder);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::~string((string *)&folder);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

string VCFrontEnd::genOutputFileName(const string& in_file, const VertexClustering::Options& opts)
{
	stringstream ss;
	size_t k = in_file.find_last_of('/');
	string folder = ".", name = in_file;
	if (k != string::npos) {
		folder = in_file.substr(0, k);
		name = in_file.substr(k + 1);
	}
	name = name.substr(0, name.find_last_of('.'));
	string out_folder = folder + "/outputs";
#if defined(_WIN32)
	CreateDirectory(out_folder.c_str(), NULL);
#else
	system(("mkdir -p " + out_folder).c_str());
#endif
	ss << out_folder << "/" << name;
	if (opts.anisotropic)    ss << "_ais";
	else if (opts.adaptive)  ss << "_adp";
	else                     ss << "_uni";
	if (opts.quadMetric)     ss << "_q";
	if (opts.validation)     ss << "_v";
	if (opts.ringLevel != 2) ss << "_r" << opts.ringLevel;
	ss << "_" << opts.numCluster << ".obj";
	return ss.str();
}